

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::adjustFieldTypes
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *pattern,PtnSkeleton *specifiedSkeleton,int32_t flags,
          UDateTimePatternMatchOptions options)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  DateTimeMatcher *pDVar4;
  int iVar5;
  int iVar6;
  undefined2 uVar7;
  UBool UVar8;
  uint uVar9;
  FormatParser *pFVar10;
  undefined8 uVar11;
  char16_t cVar12;
  int32_t srcLength;
  int iVar13;
  int iVar14;
  char16_t cVar15;
  undefined4 uVar16;
  UnicodeString field;
  UnicodeString quoteLiteral;
  int32_t local_dc;
  UnicodeString *local_d8;
  UDateTimePatternMatchOptions local_d0;
  uint local_cc;
  PtnSkeleton *local_c8;
  UnicodeString *local_c0;
  UObject local_b8;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_b8._vptr_UObject = (_func_int **)&PTR__UnicodeString_00487e70;
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  local_d8 = __return_storage_ptr__;
  local_d0 = options;
  local_cc = flags;
  local_c8 = specifiedSkeleton;
  FormatParser::set(this->fp,pattern);
  local_dc = 0;
  pFVar10 = this->fp;
  if (0 < pFVar10->itemNumber) {
    local_c0 = &this->decimal;
    do {
      icu_63::UnicodeString::UnicodeString
                (&local_b0,(UnicodeString *)(&pFVar10->field_0x8 + (long)local_dc * 0x40));
      uVar7 = local_b0.fUnion.fStackFields.fLengthAndFlags;
      uVar16 = local_b0.fUnion.fFields.fLength;
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        uVar16 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (uVar16 == 0) {
LAB_002e8226:
        UVar8 = FormatParser::isPatternSeparator(this->fp,&local_b0);
        if (UVar8 == '\0') {
          uVar9 = FormatParser::getCanonicalIndex(&local_b0,'\x01');
          if ((int)uVar9 < 0) {
            icu_63::UnicodeString::doAppend(local_d8,&local_b0,0,uVar16);
          }
          else {
            uVar3 = *(uint *)(dtTypes + (ulong)uVar9 * 0x10 + 4);
            if (((local_cc & 1) == 0) || (uVar3 != 0xd)) {
              pDVar4 = this->dtMatcher;
              if ((pDVar4->skeleton).type[(int)uVar3] != 0) {
                cVar1 = (pDVar4->skeleton).original.chars[(int)uVar3];
                cVar15 = (char16_t)cVar1;
                iVar14 = (int)(pDVar4->skeleton).original.lengths[(int)uVar3];
                iVar13 = 3;
                if (3 < iVar14) {
                  iVar13 = iVar14;
                }
                if (cVar1 != 'E') {
                  iVar13 = iVar14;
                }
                iVar14 = uVar16;
                if (((local_d0 >> 0xb & 1) == 0) && (uVar3 == 0xb)) {
LAB_002e83ec:
                  if (uVar16 == 0) {
                    cVar15 = L'\xffff';
                  }
                  else {
                    uVar11 = local_b0.fUnion.fStackFields.fBuffer;
                    if ((uVar7 & 2) == 0) {
                      uVar11 = local_b0.fUnion.fFields.fArray;
                    }
                    cVar15 = *(char16_t *)uVar11;
                  }
                }
                else if ((uVar3 != 0xc ||
                          (local_d0 & UDATPG_MATCH_MINUTE_FIELD_LENGTH) != UDATPG_MATCH_NO_OPTIONS)
                        && ((local_d0 & UDATPG_MATCH_SECOND_FIELD_LENGTH) != UDATPG_MATCH_NO_OPTIONS
                            || uVar3 != 0xd)) {
                  iVar14 = iVar13;
                  if (local_c8 != (PtnSkeleton *)0x0) {
                    iVar5 = iVar13;
                    if (*(short *)(dtTypes + (ulong)uVar9 * 0x10 + 8) < 1) {
                      iVar5 = uVar16;
                    }
                    iVar14 = uVar16;
                    iVar6 = iVar13;
                    if (0 < local_c8->type[(int)uVar3]) {
                      iVar14 = iVar5;
                      iVar6 = iVar5;
                    }
                    if (*(short *)(dtTypes + (ulong)uVar9 * 0x10 + 8) < 1) {
                      iVar14 = iVar6;
                    }
                    if (iVar13 == (local_c8->original).lengths[(int)uVar3]) {
                      iVar14 = uVar16;
                    }
                  }
                  if (((uVar3 < 0xc) && ((0x848U >> (uVar3 & 0x1f) & 1) != 0)) ||
                     ((uVar3 == 1 && (cVar1 != 'Y')))) goto LAB_002e83ec;
                }
                cVar12 = cVar15;
                if (uVar3 == 0xb) {
                  cVar12 = this->fDefaultHourFormatChar;
                }
                if ((local_cc & 2) != 0) {
                  cVar15 = cVar12;
                }
                local_b0.fUnion.fStackFields.fLengthAndFlags = uVar7 & 0x1e;
                if ((uVar7 & 1) != 0) {
                  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
                }
                if (0 < iVar14) {
                  iVar14 = iVar14 + 1;
                  do {
                    local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = cVar15;
                    icu_63::UnicodeString::doAppend(&local_b0,(UChar *)&local_70,0,1);
                    iVar14 = iVar14 + -1;
                  } while (1 < iVar14);
                }
              }
            }
            else {
              sVar2 = (this->decimal).fUnion.fStackFields.fLengthAndFlags;
              if (sVar2 < 0) {
                srcLength = (this->decimal).fUnion.fFields.fLength;
              }
              else {
                srcLength = (int)sVar2 >> 5;
              }
              icu_63::UnicodeString::doAppend(&local_b0,local_c0,0,srcLength);
              SkeletonFields::appendFieldTo(&(this->dtMatcher->skeleton).original,0xe,&local_b0);
            }
            uVar16 = local_b0.fUnion.fFields.fLength;
            if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
              uVar16 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            icu_63::UnicodeString::doAppend(local_d8,&local_b0,0,uVar16);
          }
        }
        else {
          icu_63::UnicodeString::doAppend(local_d8,&local_b0,0,uVar16);
        }
      }
      else {
        uVar11 = local_b0.fUnion.fStackFields.fBuffer;
        if ((local_b0.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
          uVar11 = local_b0.fUnion.fFields.fArray;
        }
        if (*(char16_t *)uVar11 != L'\'') goto LAB_002e8226;
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)(UObject)local_b8._vptr_UObject;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        FormatParser::getQuoteLiteral(this->fp,&local_70,&local_dc);
        uVar16 = local_70.fUnion.fFields.fLength;
        if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
          uVar16 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        icu_63::UnicodeString::doAppend(local_d8,&local_70,0,uVar16);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
      icu_63::UnicodeString::~UnicodeString(&local_b0);
      local_dc = local_dc + 1;
      pFVar10 = this->fp;
    } while (local_dc < pFVar10->itemNumber);
  }
  return local_d8;
}

Assistant:

UnicodeString
DateTimePatternGenerator::adjustFieldTypes(const UnicodeString& pattern,
                                           const PtnSkeleton* specifiedSkeleton,
                                           int32_t flags,
                                           UDateTimePatternMatchOptions options) {
    UnicodeString newPattern;
    fp->set(pattern);
    for (int32_t i=0; i < fp->itemNumber; i++) {
        UnicodeString field = fp->items[i];
        if ( fp->isQuoteLiteral(field) ) {

            UnicodeString quoteLiteral;
            fp->getQuoteLiteral(quoteLiteral, &i);
            newPattern += quoteLiteral;
        }
        else {
            if (fp->isPatternSeparator(field)) {
                newPattern+=field;
                continue;
            }
            int32_t canonicalIndex = fp->getCanonicalIndex(field);
            if (canonicalIndex < 0) {
                newPattern+=field;
                continue;  // don't adjust
            }
            const dtTypeElem *row = &dtTypes[canonicalIndex];
            int32_t typeValue = row->field;

            // handle day periods - with #13183, no longer need special handling here, integrated with normal types

            if ((flags & kDTPGFixFractionalSeconds) != 0 && typeValue == UDATPG_SECOND_FIELD) {
                field += decimal;
                dtMatcher->skeleton.original.appendFieldTo(UDATPG_FRACTIONAL_SECOND_FIELD, field);
            } else if (dtMatcher->skeleton.type[typeValue]!=0) {
                    // Here:
                    // - "reqField" is the field from the originally requested skeleton, with length
                    // "reqFieldLen".
                    // - "field" is the field from the found pattern.
                    //
                    // The adjusted field should consist of characters from the originally requested
                    // skeleton, except in the case of UDATPG_HOUR_FIELD or UDATPG_MONTH_FIELD or
                    // UDATPG_WEEKDAY_FIELD or UDATPG_YEAR_FIELD, in which case it should consist
                    // of characters from the  found pattern.
                    //
                    // The length of the adjusted field (adjFieldLen) should match that in the originally
                    // requested skeleton, except that in the following cases the length of the adjusted field
                    // should match that in the found pattern (i.e. the length of this pattern field should
                    // not be adjusted):
                    // 1. typeValue is UDATPG_HOUR_FIELD/MINUTE/SECOND and the corresponding bit in options is
                    //    not set (ticket #7180). Note, we may want to implement a similar change for other
                    //    numeric fields (MM, dd, etc.) so the default behavior is to get locale preference for
                    //    field length, but options bits can be used to override this.
                    // 2. There is a specified skeleton for the found pattern and one of the following is true:
                    //    a) The length of the field in the skeleton (skelFieldLen) is equal to reqFieldLen.
                    //    b) The pattern field is numeric and the skeleton field is not, or vice versa.

                    UChar reqFieldChar = dtMatcher->skeleton.original.getFieldChar(typeValue);
                    int32_t reqFieldLen = dtMatcher->skeleton.original.getFieldLength(typeValue);
                    if (reqFieldChar == CAP_E && reqFieldLen < 3)
                        reqFieldLen = 3; // 1-3 for E are equivalent to 3 for c,e
                    int32_t adjFieldLen = reqFieldLen;
                    if ( (typeValue==UDATPG_HOUR_FIELD && (options & UDATPG_MATCH_HOUR_FIELD_LENGTH)==0) ||
                         (typeValue==UDATPG_MINUTE_FIELD && (options & UDATPG_MATCH_MINUTE_FIELD_LENGTH)==0) ||
                         (typeValue==UDATPG_SECOND_FIELD && (options & UDATPG_MATCH_SECOND_FIELD_LENGTH)==0) ) {
                         adjFieldLen = field.length();
                    } else if (specifiedSkeleton) {
                        int32_t skelFieldLen = specifiedSkeleton->original.getFieldLength(typeValue);
                        UBool patFieldIsNumeric = (row->type > 0);
                        UBool skelFieldIsNumeric = (specifiedSkeleton->type[typeValue] > 0);
                        if (skelFieldLen == reqFieldLen || (patFieldIsNumeric && !skelFieldIsNumeric) || (skelFieldIsNumeric && !patFieldIsNumeric)) {
                            // don't adjust the field length in the found pattern
                            adjFieldLen = field.length();
                        }
                    }
                    UChar c = (typeValue!= UDATPG_HOUR_FIELD
                            && typeValue!= UDATPG_MONTH_FIELD
                            && typeValue!= UDATPG_WEEKDAY_FIELD
                            && (typeValue!= UDATPG_YEAR_FIELD || reqFieldChar==CAP_Y))
                            ? reqFieldChar
                            : field.charAt(0);
                    if (typeValue == UDATPG_HOUR_FIELD && (flags & kDTPGSkeletonUsesCapJ) != 0) {
                        c = fDefaultHourFormatChar;
                    }
                    field.remove();
                    for (int32_t j=adjFieldLen; j>0; --j) {
                        field += c;
                    }
            }
            newPattern+=field;
        }
    }
    return newPattern;
}